

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynFunctionArgument * ParseFunctionArgument(ParseContext *ctx,bool lastExplicit,SynBase *lastType)

{
  bool bVar1;
  Lexeme *pLVar2;
  SynIdentifier *pSVar3;
  Lexeme *pLVar4;
  Lexeme *pLVar5;
  Lexeme *local_d0;
  SynBase *local_80;
  SynBase *initializer;
  char *local_68;
  char *local_60;
  undefined1 local_58 [8];
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  SynBase *type;
  bool isExplicit;
  Lexeme *start;
  SynBase *lastType_local;
  bool lastExplicit_local;
  ParseContext *ctx_local;
  
  pLVar5 = ctx->currentLexeme;
  type._7_1_ = ParseContext::Consume(ctx,"explicit");
  nameIdentifier = (SynIdentifier *)ParseType(ctx,(bool *)0x0,false);
  if (nameIdentifier == (SynIdentifier *)0x0) {
    if ((bool)type._7_1_) {
      pLVar5 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Stop
                (ctx,pLVar5,"ERROR: type name not found after \'explicit\' specifier");
    }
    ctx_local = (ParseContext *)0x0;
  }
  else {
    bVar1 = ParseContext::At(ctx,lex_string);
    if ((!bVar1) && (lastType != (SynBase *)0x0)) {
      if ((bool)type._7_1_) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Stop
                  (ctx,pLVar2,"ERROR: variable name not found after type in function variable list")
        ;
      }
      ctx->currentLexeme = pLVar5;
      nameIdentifier = (SynIdentifier *)lastType;
      type._7_1_ = lastExplicit;
    }
    name.end = (char *)0x0;
    bVar1 = anon_unknown.dwarf_104b6::CheckAt
                      (ctx,lex_string,
                       "ERROR: variable name not found after type in function variable list");
    if (bVar1) {
      _local_58 = ParseContext::Consume(ctx);
      pSVar3 = ParseContext::get<SynIdentifier>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      local_68 = (char *)local_58;
      local_60 = name.begin;
      SynIdentifier::SynIdentifier(pSVar3,pLVar2,pLVar4,_local_58);
      name.end = (char *)pSVar3;
    }
    else {
      pSVar3 = ParseContext::get<SynIdentifier>(ctx);
      InplaceStr::InplaceStr((InplaceStr *)&initializer);
      SynIdentifier::SynIdentifier(pSVar3,_initializer);
      name.end = (char *)pSVar3;
    }
    local_80 = (SynBase *)0x0;
    bVar1 = ParseContext::Consume(ctx,lex_set);
    if ((bVar1) && (local_80 = ParseTernaryExpr(ctx), local_80 == (SynBase *)0x0)) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report
                (ctx,pLVar2,"ERROR: default argument value not found after \'=\'");
      local_80 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_80,pLVar2,pLVar4);
    }
    ctx_local = (ParseContext *)ParseContext::get<SynFunctionArgument>(ctx);
    if (pLVar5 == ctx->currentLexeme) {
      local_d0 = ParseContext::Current(ctx);
    }
    else {
      local_d0 = ParseContext::Previous(ctx);
    }
    SynFunctionArgument::SynFunctionArgument
              ((SynFunctionArgument *)ctx_local,pLVar5,local_d0,(bool)(type._7_1_ & 1),
               &nameIdentifier->super_SynBase,(SynIdentifier *)name.end,local_80);
  }
  return (SynFunctionArgument *)ctx_local;
}

Assistant:

SynFunctionArgument* ParseFunctionArgument(ParseContext &ctx, bool lastExplicit, SynBase *lastType)
{
	Lexeme *start = ctx.currentLexeme;

	bool isExplicit = ctx.Consume("explicit");

	if(SynBase *type = ParseType(ctx))
	{
		if(!ctx.At(lex_string) && lastType)
		{
			if(isExplicit)
				Stop(ctx, ctx.Current(), "ERROR: variable name not found after type in function variable list");

			// Backtrack
			ctx.currentLexeme = start;

			isExplicit = lastExplicit;
			type = lastType;
		}

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: variable name not found after type in function variable list"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseTernaryExpr(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: default argument value not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(start, start == ctx.currentLexeme ? ctx.Current() : ctx.Previous(), isExplicit, type, nameIdentifier, initializer);
	}

	if(isExplicit)
		Stop(ctx, ctx.Current(), "ERROR: type name not found after 'explicit' specifier");

	return NULL;
}